

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O0

csp_packet_t * csp_eth_pbuf_find(csp_eth_interface_data_t *ifdata,uint32_t id,int *task_woken)

{
  csp_packet_t *pcVar1;
  long in_RDX;
  uint32_t in_ESI;
  long in_RDI;
  csp_packet_t *packet;
  uint32_t now;
  uint32_t local_34;
  csp_packet_t *local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDX == 0) {
    local_34 = csp_get_ms();
  }
  else {
    local_34 = csp_get_ms_isr();
  }
  local_30 = *(csp_packet_t **)(in_RDI + 0x78);
  while( true ) {
    if (local_30 == (csp_packet_t *)0x0) {
      pcVar1 = csp_eth_pbuf_new((csp_eth_interface_data_t *)
                                CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                (uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX,
                                (int *)CONCAT44(local_34,in_stack_ffffffffffffffd8));
      return pcVar1;
    }
    if ((local_30->field_0).field_0.timestamp_rx == in_ESI) break;
    local_30 = local_30->next;
  }
  (local_30->field_0).field_1.last_used = local_34;
  return local_30;
}

Assistant:

csp_packet_t * csp_eth_pbuf_find(csp_eth_interface_data_t * ifdata, uint32_t id, int * task_woken) {

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = ifdata->pbufs;
	while (packet) {

		if (packet->cfpid == id) {
			packet->last_used = now;
			return packet;
		}
		packet = packet->next;
	}

	return csp_eth_pbuf_new(ifdata, id, now, task_woken);

}